

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

ImVector_ImFontConfig *
ImVector_ImFontConfig_ImVector_ImFontConfigVector(ImVector_ImFontConfig *src)

{
  ImVector<ImFontConfig> *this;
  ImVector_ImFontConfig *src_local;
  
  ImGui::MemAlloc(0x10);
  this = (ImVector<ImFontConfig> *)operator_new(0x10);
  ImVector<ImFontConfig>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_ImFontConfig* ImVector_ImFontConfig_ImVector_ImFontConfigVector(const ImVector_ImFontConfig src)
{
    return IM_NEW(ImVector_ImFontConfig)(src);
}